

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_param_ref.cpp
# Opt level: O1

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformParamRef(Transformer *this,PGParamRef *node)

{
  char *__s;
  _Head_base<0UL,_duckdb::ParameterExpression_*,_false> _Var1;
  Transformer *this_00;
  idx_t iVar2;
  const_iterator cVar3;
  pointer pPVar4;
  pointer pcVar5;
  ParserException *this_01;
  long in_RDX;
  _Alloc_hider new_count;
  templated_unique_single_t expr;
  idx_t known_param_index;
  PreparedParam param;
  _Head_base<0UL,_duckdb::ParameterExpression_*,_false> local_c0;
  string local_b8;
  string local_98;
  PreparedParamType local_78;
  string local_70;
  string local_50;
  
  this_00 = (Transformer *)operator_new(0x58);
  ParameterExpression::ParameterExpression((ParameterExpression *)this_00);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  __s = *(char **)(in_RDX + 0x10);
  local_c0._M_head_impl = (ParameterExpression *)this_00;
  if (__s == (char *)0x0) {
    if (*(int *)(in_RDX + 4) < 0) {
      this_01 = (ParserException *)__cxa_allocate_exception(0x10);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"Parameter numbers cannot be negative","");
      ParserException::ParserException(this_01,&local_98);
      __cxa_throw(this_01,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_b8.field_2._M_allocated_capacity._0_2_ = 0x6425;
    local_b8._M_string_length = 2;
    local_b8.field_2._M_local_buf[2] = '\0';
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    Exception::ConstructMessage<int>(&local_98,&local_b8,*(int *)(in_RDX + 4));
    ::std::__cxx11::string::operator=((string *)&local_70,(string *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    local_78 = *(int *)(in_RDX + 4) != 0;
  }
  else {
    local_78 = NAMED;
    strlen(__s);
    ::std::__cxx11::string::_M_replace((ulong)&local_70,0,(char *)0x0,(ulong)__s);
  }
  local_b8._M_dataplus._M_p = (pointer)0xffffffffffffffff;
  GetParam((Transformer *)node,&local_70,(idx_t *)&local_b8,local_78);
  if (local_b8._M_dataplus._M_p == (pointer)0xffffffffffffffff) {
    if (*(int *)(in_RDX + 4) == 0) {
      iVar2 = ParamCount((Transformer *)node);
      local_b8._M_dataplus._M_p = (pointer)(iVar2 + 1);
      if (*(long *)(in_RDX + 0x10) == 0) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"%d","");
        Exception::ConstructMessage<unsigned_long>
                  (&local_98,&local_50,(unsigned_long)local_b8._M_dataplus._M_p);
        ::std::__cxx11::string::operator=((string *)&local_70,(string *)&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
    }
    else {
      local_b8._M_dataplus._M_p =
           (pointer)NumericCastImpl<unsigned_long,_int,_false>::Convert(*(int *)(in_RDX + 4));
    }
    cVar3 = ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)(node + 1),&local_70);
    if (cVar3.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
        ._M_cur == (__node_type *)0x0) {
      SetParam((Transformer *)node,&local_70,(idx_t)local_b8._M_dataplus._M_p,local_78);
    }
  }
  pPVar4 = unique_ptr<duckdb::ParameterExpression,_std::default_delete<duckdb::ParameterExpression>,_true>
           ::operator->((unique_ptr<duckdb::ParameterExpression,_std::default_delete<duckdb::ParameterExpression>,_true>
                         *)&local_c0);
  ::std::__cxx11::string::_M_assign((string *)&pPVar4->identifier);
  pcVar5 = (pointer)ParamCount((Transformer *)node);
  new_count._M_p = local_b8._M_dataplus._M_p;
  if (local_b8._M_dataplus._M_p < pcVar5) {
    new_count._M_p = pcVar5;
  }
  SetParamCount((Transformer *)node,(idx_t)new_count._M_p);
  _Var1._M_head_impl = local_c0._M_head_impl;
  local_c0._M_head_impl = (ParameterExpression *)0x0;
  (this->parent).ptr = (Transformer *)_Var1._M_head_impl;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_c0._M_head_impl != (ParameterExpression *)0x0) {
    (*((local_c0._M_head_impl)->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[1]
    )();
  }
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformParamRef(duckdb_libpgquery::PGParamRef &node) {
	auto expr = make_uniq<ParameterExpression>();

	auto param = GetParameterIdentifier(node);
	idx_t known_param_index = DConstants::INVALID_INDEX;
	// This is a named parameter, try to find an entry for it
	GetParam(param.identifier, known_param_index, param.type);

	if (known_param_index == DConstants::INVALID_INDEX) {
		// We have not seen this parameter before
		if (node.number != 0) {
			// Preserve the parameter number
			known_param_index = NumericCast<idx_t>(node.number);
		} else {
			known_param_index = ParamCount() + 1;
			if (!node.name) {
				param.identifier = StringUtil::Format("%d", known_param_index);
			}
		}

		if (!named_param_map.count(param.identifier)) {
			// Add it to the named parameter map so we can find it next time it's referenced
			SetParam(param.identifier, known_param_index, param.type);
		}
	}

	expr->identifier = param.identifier;
	idx_t new_param_count = MaxValue<idx_t>(ParamCount(), known_param_index);
	SetParamCount(new_param_count);
	return std::move(expr);
}